

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O1

void kca_ffd(kca_joint *joint,ma_abi *m,ma_wrench *f)

{
  frame *pfVar1;
  frame *pfVar2;
  
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x5a,
                  "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                 );
  }
  if (m == (ma_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x5b,
                  "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                 );
  }
  if (f == (ma_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x5c,
                  "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                 );
  }
  pfVar1 = m->frame;
  if (pfVar1 != (frame *)0x0) {
    if (m->point != pfVar1->origin) {
      __assert_fail("m->point == m->frame->origin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x5e,
                    "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                   );
    }
    if (joint->target_body == m->body) {
      pfVar2 = joint->target_frame;
      if (pfVar2 == pfVar1) {
        f->body = joint->reference_body;
        f->frame = pfVar2;
        f->point = pfVar2->origin;
        return;
      }
      __assert_fail("joint->target_frame == m->frame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x60,
                    "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                   );
    }
    __assert_fail("joint->target_body == m->body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x5f,
                  "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)"
                 );
  }
  __assert_fail("m->frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x5d,
                "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)")
  ;
}

Assistant:

void kca_ffd(
        const struct kca_joint *joint,
        const struct ma_abi *m,
        struct ma_wrench *f)
{
    assert(joint);
    assert(m);
    assert(f);
    assert(m->frame);
    assert(m->point == m->frame->origin);
    assert(joint->target_body == m->body);
    assert(joint->target_frame == m->frame);

    f->body = joint->reference_body;
    f->frame = joint->target_frame;
    f->point = joint->target_frame->origin;
}